

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_CallSpecial
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  PClass *pPVar2;
  int iVar3;
  int arg3;
  undefined4 extraout_var;
  char *pcVar5;
  int arg2;
  int arg4;
  int iVar6;
  AActor *activator;
  bool bVar7;
  PClass *pPVar4;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003cb3b5;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003cb3a5:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003cb3b5:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x595,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  activator = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (activator == (AActor *)0x0) goto LAB_003cb24e;
    pPVar4 = (activator->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(activator->super_DThinker).super_DObject._vptr_DObject)(activator);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (activator->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar7 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar7) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003cb3b5;
    }
  }
  else {
    if (activator != (AActor *)0x0) goto LAB_003cb3a5;
LAB_003cb24e:
    activator = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_003cb3dd:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x596,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_003cb3dd;
  }
  pVVar1 = param + 1;
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003cb4a9;
    }
    iVar3 = param[2].field_0.i;
LAB_003cb2a2:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cb4c8:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x598,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    arg2 = param[3].field_0.i;
LAB_003cb2b1:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cb43a:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x599,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    arg3 = param[4].field_0.i;
LAB_003cb2c0:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cb41b:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x59a,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    arg4 = param[5].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_003cb4a9:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x597,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar3 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003cb2a2;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cb4c8;
    }
    arg2 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003cb2b1;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cb43a;
    }
    arg3 = param[4].field_0.i;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003cb2c0;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cb41b;
    }
    arg4 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003cb3fc;
      }
      goto LAB_003cb2da;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cb3fc:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x59b,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
LAB_003cb2da:
  iVar6 = 0;
  iVar3 = P_ExecuteSpecial((pVVar1->field_0).i,(line_t *)0x0,activator,false,iVar3,arg2,arg3,arg4,
                           param[6].field_0.i);
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x59f,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(uint *)ret->Location = (uint)(iVar3 != 0);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CallSpecial)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(special);
	PARAM_INT_DEF	(arg1);
	PARAM_INT_DEF	(arg2);
	PARAM_INT_DEF	(arg3);
	PARAM_INT_DEF	(arg4);
	PARAM_INT_DEF	(arg5);

	bool res = !!P_ExecuteSpecial(special, NULL, self, false, arg1, arg2, arg3, arg4, arg5);

	ACTION_RETURN_BOOL(res);
}